

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

void Gli_ManSimulateSeqPref(Gli_Man_t *p,int nPref)

{
  Gli_Obj_t *pNode;
  int iVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  Gli_Man_t *p_00;
  ulong uVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  long lVar15;
  
  pVVar13 = p->vCis;
  uVar6 = p->nRegs;
  iVar14 = pVVar13->nSize;
  uVar9 = iVar14 - uVar6;
  p_00 = p;
  if (uVar9 != 0 && (int)uVar6 <= iVar14) {
    lVar15 = 0;
    do {
      if (iVar14 <= lVar15) goto LAB_006b6f86;
      piVar3 = p->pObjData;
      if (piVar3 == (int *)0x0) break;
      iVar14 = pVVar13->pArray[lVar15];
      p_00 = (Gli_Man_t *)0x0;
      uVar6 = Gia_ManRandom(0);
      piVar3[(long)iVar14 + 4] = uVar6;
      lVar15 = lVar15 + 1;
      pVVar13 = p->vCis;
      uVar6 = p->nRegs;
      iVar14 = pVVar13->nSize;
      uVar9 = iVar14 - uVar6;
    } while (lVar15 < (int)uVar9);
  }
  if (0 < (int)uVar6) {
    uVar10 = (ulong)uVar9;
    p_00 = (Gli_Man_t *)(ulong)uVar6;
    do {
      if (((int)uVar9 < 0) || (iVar14 <= (int)uVar10)) {
LAB_006b6f86:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pObjData == (int *)0x0) break;
      p->pObjData[(long)pVVar13->pArray[uVar10] + 4] = 0;
      uVar10 = uVar10 + 1;
      p_00 = (Gli_Man_t *)((long)&p_00[-1].pSimInfoPrev + 7);
    } while (p_00 != (Gli_Man_t *)0x0);
  }
  if (0 < nPref) {
    iVar14 = 0;
    do {
      iVar8 = p->nObjData;
      if (0 < iVar8) {
        uVar10 = 0;
        do {
          if (p->pObjData == (int *)0x0) break;
          pNode = (Gli_Obj_t *)(p->pObjData + uVar10);
          uVar6 = *(uint *)pNode;
          if ((uVar6 & 1) == 0) {
            uVar6 = Gli_ManSimulateSeqNode(p_00,pNode);
            pNode->uSimInfo = uVar6;
            uVar6 = *(uint *)pNode;
            iVar8 = p->nObjData;
          }
          uVar6 = (int)uVar10 + (uVar6 >> 7) + (uVar6 >> 4 & 7) + 7;
          uVar10 = (ulong)uVar6;
        } while ((int)uVar6 < iVar8);
        uVar6 = p->nRegs;
      }
      if (0 < (int)uVar6) {
        pVVar13 = p->vCos;
        iVar8 = pVVar13->nSize;
        uVar10 = (ulong)(iVar8 - uVar6);
        p_00 = (Gli_Man_t *)(ulong)uVar6;
        do {
          if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) goto LAB_006b6f86;
          piVar3 = p->pObjData;
          if (piVar3 == (int *)0x0) break;
          iVar1 = pVVar13->pArray[uVar10];
          piVar3[(long)iVar1 + 4] = piVar3[(long)iVar1 + (4 - (long)piVar3[(long)iVar1 + 7])];
          uVar10 = uVar10 + 1;
          p_00 = (Gli_Man_t *)((long)&p_00[-1].pSimInfoPrev + 7);
        } while (p_00 != (Gli_Man_t *)0x0);
      }
      pVVar13 = p->vCis;
      iVar8 = pVVar13->nSize;
      uVar9 = iVar8 - uVar6;
      if (uVar9 != 0 && (int)uVar6 <= iVar8) {
        lVar15 = 0;
        do {
          if (iVar8 <= lVar15) goto LAB_006b6f86;
          piVar3 = p->pObjData;
          if (piVar3 == (int *)0x0) break;
          iVar8 = pVVar13->pArray[lVar15];
          p_00 = (Gli_Man_t *)0x0;
          uVar6 = Gia_ManRandom(0);
          piVar3[(long)iVar8 + 4] = uVar6;
          lVar15 = lVar15 + 1;
          pVVar13 = p->vCis;
          uVar6 = p->nRegs;
          iVar8 = pVVar13->nSize;
          uVar9 = iVar8 - uVar6;
        } while (lVar15 < (int)uVar9);
      }
      if (0 < (int)uVar6) {
        pVVar4 = p->vCos;
        uVar2 = pVVar4->nSize;
        p_00 = (Gli_Man_t *)(ulong)uVar2;
        uVar10 = (ulong)(uVar2 - uVar6);
        uVar11 = (ulong)uVar9;
        uVar12 = (ulong)uVar6;
        do {
          if (((int)uVar10 < 0) || ((int)uVar2 <= (int)uVar10)) goto LAB_006b6f86;
          piVar3 = p->pObjData;
          if (piVar3 == (int *)0x0) break;
          if (((int)uVar9 < 0) || (iVar8 <= (int)uVar11)) goto LAB_006b6f86;
          piVar3[(long)pVVar13->pArray[uVar11] + 4] = piVar3[(long)pVVar4->pArray[uVar10] + 4];
          uVar11 = uVar11 + 1;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != nPref);
  }
  puVar7 = p->pSimInfoPrev;
  iVar14 = pVVar13->nSize;
  if (puVar7 == (uint *)0x0) {
    puVar7 = (uint *)malloc((long)iVar14 * 4);
    p->pSimInfoPrev = puVar7;
  }
  if ((0 < iVar14) && (piVar3 = p->pObjData, piVar3 != (int *)0x0)) {
    piVar5 = pVVar13->pArray;
    lVar15 = 0;
    do {
      puVar7[lVar15] = piVar3[(long)piVar5[lVar15] + 4];
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar13->nSize);
  }
  return;
}

Assistant:

void Gli_ManSimulateSeqPref( Gli_Man_t * p, int nPref )
{
    Gli_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f;
    // initialize simulation data
    Gli_ManForEachPi( p, pObj, i )
        pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
    Gli_ManForEachRo( p, pObj, i )
        pObj->uSimInfo = 0;
    for ( f = 0; f < nPref; f++ )
    {
        // simulate one frame
        Gli_ManForEachNode( p, pObj, i )
            pObj->uSimInfo = Gli_ManSimulateSeqNode( p, pObj );
        Gli_ManForEachRi( p, pObj, i )
            pObj->uSimInfo = Gli_ObjFanin(pObj, 0)->uSimInfo;
        // initialize the next frame
        Gli_ManForEachPi( p, pObj, i )
            pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
        Gli_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRo->uSimInfo = pObjRi->uSimInfo;
    }
    // save simulation data after nPref timeframes
    if ( p->pSimInfoPrev == NULL )
        p->pSimInfoPrev = ABC_ALLOC( unsigned, Gli_ManCiNum(p) );
    Gli_ManForEachCi( p, pObj, i )
        p->pSimInfoPrev[i] = pObj->uSimInfo;
}